

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::SetGlobalGenerator(cmake *this,cmGlobalGenerator *gg)

{
  bool bVar1;
  string env;
  allocator local_31;
  string local_30;
  
  if (gg != (cmGlobalGenerator *)0x0) {
    if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
      std::__cxx11::string::string((string *)&local_30,"CC=",&local_31);
      if ((this->CCEnvironment)._M_string_length != 0) {
        std::__cxx11::string::append((string *)&local_30);
      }
      cmsys::SystemTools::PutEnv(&local_30);
      std::__cxx11::string::assign((char *)&local_30);
      if ((this->CXXEnvironment)._M_string_length != 0) {
        std::__cxx11::string::append((string *)&local_30);
      }
      cmsys::SystemTools::PutEnv(&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
    this->GlobalGenerator = gg;
    cmSystemTools::s_ForceUnixPaths = gg->ForceUnixPaths;
    bVar1 = cmsys::SystemTools::GetEnv("CXX",&this->CXXEnvironment);
    if (!bVar1) {
      std::__cxx11::string::assign((char *)&this->CXXEnvironment);
    }
    bVar1 = cmsys::SystemTools::GetEnv("CC",&this->CCEnvironment);
    if (!bVar1) {
      std::__cxx11::string::assign((char *)&this->CCEnvironment);
    }
    return;
  }
  cmSystemTools::Error
            ("Error SetGlobalGenerator called with null",(char *)0x0,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void cmake::SetGlobalGenerator(cmGlobalGenerator* gg)
{
  if (!gg) {
    cmSystemTools::Error("Error SetGlobalGenerator called with null");
    return;
  }
  // delete the old generator
  if (this->GlobalGenerator) {
    delete this->GlobalGenerator;
    // restore the original environment variables CXX and CC
    // Restore CC
    std::string env = "CC=";
    if (!this->CCEnvironment.empty()) {
      env += this->CCEnvironment;
    }
    cmSystemTools::PutEnv(env);
    env = "CXX=";
    if (!this->CXXEnvironment.empty()) {
      env += this->CXXEnvironment;
    }
    cmSystemTools::PutEnv(env);
  }

  // set the new
  this->GlobalGenerator = gg;

  // set the global flag for unix style paths on cmSystemTools as soon as
  // the generator is set.  This allows gmake to be used on windows.
  cmSystemTools::SetForceUnixPaths(this->GlobalGenerator->GetForceUnixPaths());

  // Save the environment variables CXX and CC
  if (!cmSystemTools::GetEnv("CXX", this->CXXEnvironment)) {
    this->CXXEnvironment = "";
  }
  if (!cmSystemTools::GetEnv("CC", this->CCEnvironment)) {
    this->CCEnvironment = "";
  }
}